

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
Lodtalk::ASTInterpreter::ASTInterpreter
          (ASTInterpreter *this,InterpreterProxy *interpreter,EvaluationScopePtr *initialScope,
          Oop currentSelf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  VMContext *pVVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR___cxa_pure_virtual_001649d8;
  (this->super_ScopedInterpreter).context = (VMContext *)CONCAT44(extraout_var,iVar3);
  (this->super_ScopedInterpreter).currentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (initialScope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var1 = (initialScope->super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->super_ScopedInterpreter).currentScope.
  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_00164770;
  this->interpreter = interpreter;
  pVVar2 = (this->super_ScopedInterpreter).context;
  (this->currentSelf).oop.field_0 = currentSelf.field_0;
  (this->currentSelf).context_ = pVVar2;
  OopRef::registerSelf(&this->currentSelf);
  return;
}

Assistant:

ASTInterpreter(InterpreterProxy *interpreter, const EvaluationScopePtr &initialScope, Oop currentSelf)
		: ScopedInterpreter(interpreter->getContext(), initialScope), interpreter(interpreter), currentSelf(context, currentSelf) {}